

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O1

REF_STATUS ref_adj_min_degree_node(REF_ADJ ref_adj,REF_INT *min_degree,REF_INT *min_degree_node)

{
  REF_INT *pRVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  *min_degree = -1;
  *min_degree_node = -1;
  if (0 < ref_adj->nnode) {
    pRVar1 = ref_adj->first;
    lVar2 = 0;
    do {
      iVar4 = pRVar1[lVar2];
      iVar3 = 0;
      if (iVar4 != -1) {
        iVar3 = 0;
        do {
          iVar3 = iVar3 + 1;
          iVar4 = ref_adj->item[iVar4].next;
        } while (iVar4 != -1);
      }
      if ((0 < iVar3) && ((*min_degree_node == -1 || (iVar3 < *min_degree)))) {
        *min_degree_node = (REF_INT)lVar2;
        *min_degree = iVar3;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < ref_adj->nnode);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_min_degree_node(REF_ADJ ref_adj, REF_INT *min_degree,
                                           REF_INT *min_degree_node) {
  REF_INT node, degree;
  *min_degree = REF_EMPTY;
  *min_degree_node = REF_EMPTY;

  for (node = 0; node < ref_adj_nnode(ref_adj); node++) {
    RSS(ref_adj_degree(ref_adj, node, &degree), "deg");
    if (degree > 0) {
      if (REF_EMPTY == (*min_degree_node) || degree < (*min_degree)) {
        *min_degree_node = node;
        *min_degree = degree;
      }
    }
  }

  return REF_SUCCESS;
}